

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::CPrimitiveMode::Setup(CPrimitiveMode *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar4;
  
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  this->_sizeX = *(uint *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar4 = *(uint *)(CONCAT44(extraout_var_00,iVar3) + 4);
  this->_sizeY = uVar4;
  uVar1 = this->_primitiveType;
  if ((0xd < uVar1) || ((0x3070U >> (uVar1 & 0x1f) & 1) == 0)) {
    *(byte *)&this->_sizeX = (byte)this->_sizeX & 0xfc;
    this->_sizeY = uVar4 & 0xfffffffc;
  }
  if (((int)this->_drawSizeX < 0) || ((int)this->_drawSizeY < 0)) {
    uVar4 = this->_sizeX;
    uVar2 = this->_sizeY;
    this->_drawSizeX = uVar4;
    this->_drawSizeY = uVar2;
    if (uVar1 == 0) {
      if (99 < uVar4) {
        uVar4 = 100;
      }
      this->_drawSizeX = uVar4;
      this->_sizeX = uVar4;
      uVar4 = 100;
      if (uVar2 < 100) {
        uVar4 = uVar2;
      }
      this->_drawSizeY = uVar4;
      this->_sizeY = uVar4;
    }
  }
  glu::CallLogWrapper::glClear
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x4000);
  return 0;
}

Assistant:

virtual long Setup()
	{
		_sizeX = getWindowWidth();
		_sizeY = getWindowHeight();
		if (_primitiveType != GL_TRIANGLE_STRIP && _primitiveType != GL_TRIANGLE_STRIP_ADJACENCY &&
			_primitiveType != GL_TRIANGLES && _primitiveType != GL_TRIANGLES_ADJACENCY &&
			_primitiveType != GL_TRIANGLE_FAN)
		{
			_sizeX &= (-4);
			_sizeY &= (-4);
		}
		if ((int)_drawSizeX < 0 || (int)_drawSizeY < 0)
		{
			//no PrimitiveGen dimensions given. assume same dimensions as rendered image^
			_drawSizeX = _sizeX;
			_drawSizeY = _sizeY;
			if (_primitiveType == GL_POINTS)
			{
				//clamp vertex number (and rendering size) for points to max. 10000
				_sizeX = _drawSizeX = std::min(_drawSizeX, 100u);
				_sizeY = _drawSizeY = std::min(_drawSizeY, 100u);
			}
		}

		glClear(GL_COLOR_BUFFER_BIT);
		return NO_ERROR;
	}